

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

void Gia_ObjSetXorLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int Fill;
  int Fill_00;
  int iVar6;
  
  uVar5 = (uint)*(undefined8 *)pObj;
  if ((((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) ||
     (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar5 & 0x1fffffff))) {
    __assert_fail("Gia_ObjIsXor(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x242,"void Gia_ObjSetXorLevel(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar4 = pObj + -(ulong)(uVar5 & 0x1fffffff);
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar4) && (pGVar4 < pGVar2 + p->nObjs)) {
    uVar5 = (int)((long)pGVar4 - (long)pGVar2 >> 2) * -0x55555555;
    pVVar3 = p->vLevels;
    Vec_IntFillExtra(pVVar3,uVar5 + 1,0x1fffffff);
    if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) {
LAB_00509163:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar4) && (pGVar4 < pGVar2 + p->nObjs)) {
      iVar1 = pVVar3->pArray[uVar5 & 0x7fffffff];
      uVar5 = (int)((long)pGVar4 - (long)pGVar2 >> 2) * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar5 + 1,Fill);
      if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_00509163;
      pGVar4 = p->pObjs;
      if ((pGVar4 <= pObj) && (pObj < pGVar4 + p->nObjs)) {
        iVar6 = pVVar3->pArray[uVar5 & 0x7fffffff];
        uVar5 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
        pVVar3 = p->vLevels;
        Vec_IntFillExtra(pVVar3,uVar5 + 1,Fill_00);
        if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar3->nSize)) {
          if (iVar6 < iVar1) {
            iVar6 = iVar1;
          }
          pVVar3->pArray[uVar5 & 0x7fffffff] = iVar6 + 2;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetXorLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsXor(pObj) ); Gia_ObjSetLevel( p, pObj, 2+Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))) ); }